

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_src_IEnumerableCore_hpp:177:13),_int>_>
* __thiscall
linq::IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>::
Distinct(IEnumerableCore<linq::DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_src_IEnumerableCore_hpp:177:13),_int>_>
         *__return_storage_ptr__,
        IEnumerableCore<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>_>
        *this)

{
  anon_class_1_0_00000001_for_transformer f;
  anon_class_1_0_00000001_for_transformer local_91;
  DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_src_IEnumerableCore_hpp:177:13),_int>
  local_90;
  
  DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/src/IEnumerableCore.hpp:177:13),_int>
  ::DistinctState(&local_90,&this->source,&local_91);
  DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/src/IEnumerableCore.hpp:177:13),_int>
  ::DistinctState(&__return_storage_ptr__->source,&local_90);
  DistinctState<linq::ConcatState<linq::IEnumerable<int>,_linq::IEnumerable<int>,_int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/src/IEnumerableCore.hpp:177:13),_int>
  ::~DistinctState(&local_90);
  return __return_storage_ptr__;
}

Assistant:

decltype(auto) Distinct()
		{
			auto f = [](T x) { return x; };
			using F = decltype(f);
			return IEnumerableCore<DistinctState<S, F, T>>(DistinctState<S, F, T>(std::move(source), f));
		}